

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsFederate helicsCreateCombinationFederateFromConfig(char *configFile,HelicsError *err)

{
  size_t sVar1;
  HelicsFederate pvVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_59;
  CombinationFederate *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  shared_ptr<helics::Federate> local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (configFile != (char *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      sVar1 = strlen(configFile);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,configFile,configFile + sVar1);
      local_58 = (CombinationFederate *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::__cxx11::string_const>
                (&_Stack_50,&local_58,(allocator<helics::CombinationFederate> *)&local_59,&local_48)
      ;
      local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_50._M_pi;
      if (local_58 == (CombinationFederate *)0x0) {
        peVar3 = (element_type *)0x0;
      }
      else {
        peVar3 = (element_type *)
                 ((long)&(local_58->super_ValueFederate)._vptr_ValueFederate +
                 (long)(local_58->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (CombinationFederate *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      pvVar2 = generateNewHelicsFederateObject(&local_28,COMBINATION);
      if (local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return pvVar2;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return pvVar2;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "The supplied string argument is null and therefore invalid";
    }
  }
  return (HelicsFederate)0x0;
}

Assistant:

HelicsFederate helicsCreateCombinationFederateFromConfig(const char* configFile, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    CHECK_NULL_STRING(configFile, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        fed = std::make_shared<helics::CombinationFederate>(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }

    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::COMBINATION);
}